

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioCreateWithCustomAllocatorEXT
                   (FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  FAudio *in_R8;
  FAudioFreeFunc in_R9;
  
  FAudioCOMConstructWithCustomAllocatorEXT
            ((FAudio **)CONCAT44(in_ESI,in_EDX),(uint8_t)((ulong)in_RCX >> 0x38),
             (FAudioMallocFunc)in_R8,in_R9,(FAudioReallocFunc)0x1216bc);
  FAudio_Initialize(in_R8,(uint32_t)((ulong)in_R9 >> 0x20),(FAudioProcessor)in_R9);
  return 0;
}

Assistant:

uint32_t FAudioCreateWithCustomAllocatorEXT(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		FAUDIO_TARGET_VERSION,
		customMalloc,
		customFree,
		customRealloc
	);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}